

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_pxr24.c
# Opt level: O0

exr_result_t internal_exr_apply_pxr24(exr_encode_pipeline_t *encode)

{
  exr_result_t rv;
  size_t *in_stack_00000010;
  void **in_stack_00000018;
  exr_transcoding_pipeline_buffer_id_t in_stack_00000024;
  exr_encode_pipeline_t *in_stack_00000028;
  exr_encode_pipeline_t *in_stack_000000e8;
  undefined4 local_4;
  
  local_4 = internal_encode_alloc_buffer
                      (in_stack_00000028,in_stack_00000024,in_stack_00000018,in_stack_00000010,
                       (size_t)encode);
  if (local_4 == 0) {
    local_4 = apply_pxr24_impl(in_stack_000000e8);
  }
  return local_4;
}

Assistant:

exr_result_t
internal_exr_apply_pxr24 (exr_encode_pipeline_t* encode)
{
    exr_result_t rv;
    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        encode->packed_bytes);
    if (rv != EXR_ERR_SUCCESS) return rv;

    return apply_pxr24_impl (encode);
}